

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_iterate<EasyUseMap<HashObject<4,4>,int>>(int iters)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  int in_EDI;
  int unaff_retaddr;
  double in_stack_00000008;
  char *in_stack_00000010;
  double ut;
  const_iterator it_end;
  const_iterator it;
  int i;
  int r;
  Rusage t;
  EasyUseMap<HashObject<4,_4>,_int> set;
  map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  *in_stack_ffffffffffffff68;
  _Rb_tree_const_iterator<std::pair<const_HashObject<4,_4>,_int>_> *in_stack_ffffffffffffff70;
  Rusage *in_stack_ffffffffffffff80;
  iterator local_78;
  _Rb_tree_const_iterator<std::pair<const_HashObject<4,_4>,_int>_> local_70;
  iterator local_68;
  _Rb_tree_const_iterator<std::pair<const_HashObject<4,_4>,_int>_> local_60;
  HashObject<4,_4> in_stack_ffffffffffffffa8;
  int i_00;
  undefined4 in_stack_ffffffffffffffb0;
  uint __seed;
  undefined4 in_stack_ffffffffffffffb4;
  size_t in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff8;
  
  EasyUseMap<HashObject<4,_4>,_int>::EasyUseMap((EasyUseMap<HashObject<4,_4>,_int> *)0x1d65e8);
  Rusage::Rusage((Rusage *)in_stack_ffffffffffffff70);
  for (i_00 = 0; i_00 < in_EDI; i_00 = i_00 + 1) {
    iVar2 = i_00 + 1;
    HashObject<4,_4>::HashObject((HashObject<4,_4> *)&stack0xffffffffffffffa8,i_00);
    in_stack_ffffffffffffff70 =
         (_Rb_tree_const_iterator<std::pair<const_HashObject<4,_4>,_int>_> *)
         std::
         map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
         ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                       *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (key_type *)CONCAT44(i_00,in_stack_ffffffffffffffa8.i_));
    *(int *)&(((time_point *)&in_stack_ffffffffffffff70->_M_node)->__d).__r = iVar2;
  }
  __seed = 1;
  Rusage::Reset((Rusage *)in_stack_ffffffffffffff70);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
       ::begin(in_stack_ffffffffffffff68);
  std::_Rb_tree_const_iterator<std::pair<const_HashObject<4,_4>,_int>_>::_Rb_tree_const_iterator
            (&local_60,&local_68);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
       ::end(in_stack_ffffffffffffff68);
  std::_Rb_tree_const_iterator<std::pair<const_HashObject<4,_4>,_int>_>::_Rb_tree_const_iterator
            (&local_70,&local_78);
  while( true ) {
    bVar1 = std::operator!=(&local_60,&local_70);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_HashObject<4,_4>,_int>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_HashObject<4,_4>,_int>_> *)0x1d66d9
                       );
    __seed = ppVar3->second ^ __seed;
    std::_Rb_tree_const_iterator<std::pair<const_HashObject<4,_4>,_int>_>::operator++
              (in_stack_ffffffffffffff70);
  }
  Rusage::UserTime(in_stack_ffffffffffffff80);
  srand(__seed);
  report(in_stack_00000010,in_stack_00000008,unaff_retaddr,
         CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0);
  EasyUseMap<HashObject<4,_4>,_int>::~EasyUseMap((EasyUseMap<HashObject<4,_4>,_int> *)0x1d6741);
  return;
}

Assistant:

static void time_map_iterate(int iters) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (typename MapType::const_iterator it = set.begin(), it_end = set.end();
       it != it_end; ++it) {
    r ^= it->second;
  }

  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report("map_iterate", ut, iters, 0, 0);
}